

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O0

void __thiscall
ExprVariableAccess::ExprVariableAccess
          (ExprVariableAccess *this,SynBase *source,TypeBase *type,VariableData *variable)

{
  VariableData *variable_local;
  TypeBase *type_local;
  SynBase *source_local;
  ExprVariableAccess *this_local;
  
  ExprBase::ExprBase(&this->super_ExprBase,0x22,source,type);
  (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprVariableAccess_00307f80;
  this->variable = variable;
  if (variable == (VariableData *)0x0) {
    __assert_fail("variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                  ,0x3a9,
                  "ExprVariableAccess::ExprVariableAccess(SynBase *, TypeBase *, VariableData *)");
  }
  if (type == variable->type) {
    if (((variable->lookupOnly ^ 0xffU) & 1) == 0) {
      __assert_fail("!variable->lookupOnly",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                    ,0x3ab,
                    "ExprVariableAccess::ExprVariableAccess(SynBase *, TypeBase *, VariableData *)")
      ;
    }
    return;
  }
  __assert_fail("type == variable->type",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                ,0x3aa,
                "ExprVariableAccess::ExprVariableAccess(SynBase *, TypeBase *, VariableData *)");
}

Assistant:

ExprVariableAccess(SynBase *source, TypeBase *type, VariableData *variable): ExprBase(myTypeID, source, type), variable(variable)
	{
		assert(variable);
		assert(type == variable->type);
		assert(!variable->lookupOnly);
	}